

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O0

void __thiscall icu_63::RegexPattern::zap(RegexPattern *this)

{
  int32_t iVar1;
  UnicodeSet *pUVar2;
  void *in_RSI;
  UnicodeSet *s;
  int i;
  RegexPattern *this_local;
  
  if (this->fCompiledPat != (UVector64 *)0x0) {
    (*(this->fCompiledPat->super_UObject)._vptr_UObject[1])();
  }
  this->fCompiledPat = (UVector64 *)0x0;
  for (s._4_4_ = 1; iVar1 = UVector::size(this->fSets), (int)s._4_4_ < iVar1; s._4_4_ = s._4_4_ + 1)
  {
    in_RSI = (void *)(ulong)s._4_4_;
    pUVar2 = (UnicodeSet *)UVector::elementAt(this->fSets,s._4_4_);
    if ((pUVar2 != (UnicodeSet *)0x0) && (pUVar2 != (UnicodeSet *)0x0)) {
      UnicodeSet::~UnicodeSet(pUVar2);
      UMemory::operator_delete((UMemory *)pUVar2,in_RSI);
    }
  }
  if (this->fSets != (UVector *)0x0) {
    (*(this->fSets->super_UObject)._vptr_UObject[1])();
  }
  this->fSets = (UVector *)0x0;
  if ((UMemory *)this->fSets8 != (UMemory *)0x0) {
    UMemory::operator_delete__((UMemory *)this->fSets8,in_RSI);
  }
  this->fSets8 = (Regex8BitSet *)0x0;
  if (this->fGroupMap != (UVector32 *)0x0) {
    (*(this->fGroupMap->super_UObject)._vptr_UObject[1])();
  }
  this->fGroupMap = (UVector32 *)0x0;
  pUVar2 = this->fInitialChars;
  if (pUVar2 != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet(pUVar2);
    UMemory::operator_delete((UMemory *)pUVar2,in_RSI);
  }
  this->fInitialChars = (UnicodeSet *)0x0;
  if ((UMemory *)this->fInitialChars8 != (UMemory *)0x0) {
    UMemory::operator_delete((UMemory *)this->fInitialChars8,in_RSI);
  }
  this->fInitialChars8 = (Regex8BitSet *)0x0;
  if (this->fPattern != (UText *)0x0) {
    utext_close_63(this->fPattern);
    this->fPattern = (UText *)0x0;
  }
  if (this->fPatternString != (UnicodeString *)0x0) {
    if (this->fPatternString != (UnicodeString *)0x0) {
      (*(this->fPatternString->super_Replaceable).super_UObject._vptr_UObject[1])();
    }
    this->fPatternString = (UnicodeString *)0x0;
  }
  uhash_close_63(this->fNamedCaptureMap);
  this->fNamedCaptureMap = (UHashtable *)0x0;
  return;
}

Assistant:

void RegexPattern::zap() {
    delete fCompiledPat;
    fCompiledPat = NULL;
    int i;
    for (i=1; i<fSets->size(); i++) {
        UnicodeSet *s;
        s = (UnicodeSet *)fSets->elementAt(i);
        if (s != NULL) {
            delete s;
        }
    }
    delete fSets;
    fSets = NULL;
    delete[] fSets8;
    fSets8 = NULL;
    delete fGroupMap;
    fGroupMap = NULL;
    delete fInitialChars;
    fInitialChars = NULL;
    delete fInitialChars8;
    fInitialChars8 = NULL;
    if (fPattern != NULL) {
        utext_close(fPattern);
        fPattern = NULL;
    }
    if (fPatternString != NULL) {
        delete fPatternString;
        fPatternString = NULL;
    }
    uhash_close(fNamedCaptureMap);
    fNamedCaptureMap = NULL;
}